

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

Symbol * __thiscall hdc::SymbolTable::add(SymbolTable *this,GlobalVariable *var)

{
  Symbol *this_00;
  mapped_type *ppSVar1;
  string local_40;
  
  this_00 = (Symbol *)operator_new(0x38);
  Symbol::Symbol(this_00,var);
  Variable::getName_abi_cxx11_(&local_40,&var->super_Variable);
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::Symbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::Symbol_*>_>_>
            ::operator[](&this->symbols,&local_40);
  *ppSVar1 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return this_00;
}

Assistant:

Symbol*SymbolTable::add(GlobalVariable* var) {
    Symbol* symbol = new Symbol(var);
    symbols[var->getName()] = symbol;
    return symbol;
}